

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

int partition_plane_context(MACROBLOCKD *xd,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  byte bVar1;
  int left;
  int above;
  int bsl;
  PARTITION_CONTEXT *left_ctx;
  PARTITION_CONTEXT *above_ctx;
  BLOCK_SIZE bsize_local;
  int mi_col_local;
  int mi_row_local;
  MACROBLOCKD *xd_local;
  
  bVar1 = (byte)(""[bsize] - 1);
  return ((int)xd->left_partition_context[(int)(mi_row & 0x1f)] >> (bVar1 & 0x1f) & 1U) * 2 +
         ((int)xd->above_partition_context[mi_col] >> (bVar1 & 0x1f) & 1U) + (""[bsize] - 1) * 4;
}

Assistant:

static inline int partition_plane_context(const MACROBLOCKD *xd, int mi_row,
                                          int mi_col, BLOCK_SIZE bsize) {
  const PARTITION_CONTEXT *above_ctx = xd->above_partition_context + mi_col;
  const PARTITION_CONTEXT *left_ctx =
      xd->left_partition_context + (mi_row & MAX_MIB_MASK);
  // Minimum partition point is 8x8. Offset the bsl accordingly.
  const int bsl = mi_size_wide_log2[bsize] - mi_size_wide_log2[BLOCK_8X8];
  int above = (*above_ctx >> bsl) & 1, left = (*left_ctx >> bsl) & 1;

  assert(mi_size_wide_log2[bsize] == mi_size_high_log2[bsize]);
  assert(bsl >= 0);

  return (left * 2 + above) + bsl * PARTITION_PLOFFSET;
}